

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDeviceUtil.cpp
# Opt level: O0

Move<vk::VkInstance_s_*> *
vk::createDefaultInstance
          (Move<vk::VkInstance_s_*> *__return_storage_ptr__,PlatformInterface *vkPlatform,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *enabledLayers,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *enabledExtensions,VkAllocationCallbacks *pAllocator)

{
  bool bVar1;
  deUint32 dVar2;
  size_type sVar3;
  value_type pcVar4;
  reference ppcVar5;
  reference local_180;
  reference local_170;
  ulong local_110;
  size_t ndx_1;
  size_t ndx;
  VkInstanceCreateInfo instanceInfo;
  VkApplicationInfo appInfo;
  allocator<const_char_*> local_79;
  deUint32 apiVersion;
  vector<const_char_*,_std::allocator<const_char_*>_> extensionNamePtrs;
  allocator<const_char_*> local_49;
  undefined1 local_48 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> layerNamePtrs;
  VkAllocationCallbacks *pAllocator_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *enabledExtensions_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *enabledLayers_local;
  PlatformInterface *vkPlatform_local;
  
  layerNamePtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pAllocator;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(enabledLayers);
  std::allocator<const_char_*>::allocator(&local_49);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,sVar3,&local_49);
  std::allocator<const_char_*>::~allocator(&local_49);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(enabledExtensions);
  std::allocator<const_char_*>::allocator(&local_79);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&apiVersion,sVar3,&local_79);
  std::allocator<const_char_*>::~allocator(&local_79);
  ApiVersion::ApiVersion((ApiVersion *)&appInfo.apiVersion,1,0,0);
  dVar2 = pack((ApiVersion *)&appInfo.apiVersion);
  instanceInfo.ppEnabledExtensionNames._0_4_ = 0;
  appInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  appInfo._4_4_ = 0;
  appInfo.pNext = anon_var_dwarf_13bf74f;
  appInfo.pApplicationName._0_4_ = qpGetReleaseId();
  appInfo._24_8_ = anon_var_dwarf_13bf74f;
  appInfo.pEngineName._0_4_ = qpGetReleaseId();
  ndx._0_4_ = 1;
  instanceInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  instanceInfo._4_4_ = 0;
  instanceInfo.pNext._0_4_ = 0;
  instanceInfo._16_8_ = &instanceInfo.ppEnabledExtensionNames;
  appInfo.pEngineName._4_4_ = dVar2;
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
  instanceInfo.pApplicationInfo._0_4_ = (undefined4)sVar3;
  bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
  if (bVar1) {
    local_170 = (reference)0x0;
  }
  else {
    local_170 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,0);
  }
  instanceInfo._32_8_ = local_170;
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&apiVersion);
  instanceInfo.ppEnabledLayerNames._0_4_ = (undefined4)sVar3;
  bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&apiVersion);
  if (bVar1) {
    local_180 = (reference)0x0;
  }
  else {
    local_180 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&apiVersion,0);
  }
  instanceInfo._48_8_ = local_180;
  ndx_1 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(enabledLayers);
    if (sVar3 <= ndx_1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](enabledLayers,ndx_1);
    pcVar4 = (value_type)std::__cxx11::string::c_str();
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,ndx_1);
    *ppcVar5 = pcVar4;
    ndx_1 = ndx_1 + 1;
  }
  local_110 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(enabledExtensions);
    if (sVar3 <= local_110) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](enabledExtensions,local_110);
    pcVar4 = (value_type)std::__cxx11::string::c_str();
    ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&apiVersion,
                         local_110);
    *ppcVar5 = pcVar4;
    local_110 = local_110 + 1;
  }
  createInstance(__return_storage_ptr__,vkPlatform,(VkInstanceCreateInfo *)&ndx,
                 (VkAllocationCallbacks *)
                 layerNamePtrs.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&apiVersion);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Move<VkInstance> createDefaultInstance (const PlatformInterface&		vkPlatform,
										const vector<string>&			enabledLayers,
										const vector<string>&			enabledExtensions,
										const VkAllocationCallbacks*	pAllocator)
{
	vector<const char*>		layerNamePtrs		(enabledLayers.size());
	vector<const char*>		extensionNamePtrs	(enabledExtensions.size());
	const deUint32			apiVersion			= pack(ApiVersion(1, 0, 0));

	const struct VkApplicationInfo		appInfo			=
	{
		VK_STRUCTURE_TYPE_APPLICATION_INFO,
		DE_NULL,
		"deqp",									// pAppName
		qpGetReleaseId(),						// appVersion
		"deqp",									// pEngineName
		qpGetReleaseId(),						// engineVersion
		apiVersion								// apiVersion
	};
	const struct VkInstanceCreateInfo	instanceInfo	=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,
		DE_NULL,
		(VkInstanceCreateFlags)0,
		&appInfo,
		(deUint32)layerNamePtrs.size(),
		layerNamePtrs.empty() ? DE_NULL : &layerNamePtrs[0],
		(deUint32)extensionNamePtrs.size(),
		extensionNamePtrs.empty() ? DE_NULL : &extensionNamePtrs[0],
	};

	for (size_t ndx = 0; ndx < enabledLayers.size(); ++ndx)
		layerNamePtrs[ndx] = enabledLayers[ndx].c_str();

	for (size_t ndx = 0; ndx < enabledExtensions.size(); ++ndx)
		extensionNamePtrs[ndx] = enabledExtensions[ndx].c_str();

	return createInstance(vkPlatform, &instanceInfo, pAllocator);
}